

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createNode(LLVMReadWriteGraphBuilder *this,Value *v)

{
  bool bVar1;
  uint uVar2;
  ret_type Inst;
  initializer_list<dg::dda::RWNode_*> *in_RSI;
  NodesSeq<dg::dda::RWNode> *in_RDI;
  Instruction *I;
  undefined4 in_stack_ffffffffffffff08;
  RWNodeType in_stack_ffffffffffffff0c;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffff10;
  NodesSeq<dg::dda::RWNode> *in_stack_ffffffffffffff30;
  RWNode *local_c0;
  RWNode **local_b8;
  undefined8 local_b0;
  RWNode *local_a8;
  RWNode **local_a0;
  undefined8 local_98;
  RWNode *local_90;
  Instruction *in_stack_ffffffffffffff78;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffff80;
  Instruction *in_stack_ffffffffffffff88;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffff90;
  Instruction *in_stack_ffffffffffffff98;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffffa0;
  Instruction *in_stack_ffffffffffffffa8;
  initializer_list<dg::dda::RWNode_*> local_48;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffffd0;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffffd8;
  
  bVar1 = llvm::isa<llvm::GlobalVariable,llvm::Value_const*>((Value **)0x18e046);
  if (bVar1) {
    create(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
    return in_RDI;
  }
  Inst = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>((Value *)in_stack_ffffffffffffff10);
  if (Inst == (ret_type)0x0) {
    std::initializer_list<dg::dda::RWNode_*>::initializer_list(&local_48);
    NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
    return in_RDI;
  }
  uVar2 = llvm::Instruction::getOpcode((Instruction *)0x18e0e7);
  switch((LLVMReadWriteGraphBuilder *)(ulong)(uVar2 - 1)) {
  case (LLVMReadWriteGraphBuilder *)0x0:
    local_c0 = createReturn((LLVMReadWriteGraphBuilder *)(ulong)(uVar2 - 1),
                            (Instruction *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_b8 = &local_c0;
    local_b0 = 1;
    NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
    break;
  default:
    goto switchD_0018e10c_caseD_1;
  case (LLVMReadWriteGraphBuilder *)0x1e:
    createAlloc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
    break;
  case (LLVMReadWriteGraphBuilder *)0x1f:
    if (((ulong)in_RSI[0xe]._M_array & 1) != 0) {
      local_a8 = createLoad(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_a0 = &local_a8;
      local_98 = 1;
      NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
      return in_RDI;
    }
    goto switchD_0018e10c_caseD_1;
  case (LLVMReadWriteGraphBuilder *)0x20:
    createStore(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
    break;
  case (LLVMReadWriteGraphBuilder *)0x24:
    local_90 = createAtomicRMW(in_stack_ffffffffffffffd0,Inst);
    NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
    break;
  case (LLVMReadWriteGraphBuilder *)0x37:
    bVar1 = isRelevantCall<dg::LLVMDataDependenceAnalysisOptions_const>
                      (in_stack_ffffffffffffffa8,
                       (LLVMDataDependenceAnalysisOptions *)in_stack_ffffffffffffffa0);
    if (bVar1) {
      createCall(in_stack_ffffffffffffffd8,(Instruction *)in_stack_ffffffffffffffd0);
      return in_RDI;
    }
switchD_0018e10c_caseD_1:
    std::initializer_list<dg::dda::RWNode_*>::initializer_list
              ((initializer_list<dg::dda::RWNode_*> *)&stack0xffffffffffffff30);
    NodesSeq<dg::dda::RWNode>::NodesSeq(in_stack_ffffffffffffff30,in_RSI);
  }
  return in_RDI;
}

Assistant:

NodesSeq<RWNode> LLVMReadWriteGraphBuilder::createNode(const llvm::Value *v) {
    using namespace llvm;
    if (isa<GlobalVariable>(v)) {
        // global variables are like allocations
        return {&create(RWNodeType::GLOBAL)};
    }

    const auto *I = dyn_cast<Instruction>(v);
    if (!I)
        return {};

    // we may created this node when searching for an operand
    switch (I->getOpcode()) {
    case Instruction::Alloca:
        // we need alloca's as target to DefSites
        return {createAlloc(I)};
    case Instruction::Store:
        return {createStore(I)};
    case Instruction::AtomicRMW:
        return {createAtomicRMW(I)};
    case Instruction::Load:
        if (buildUses) {
            return {createLoad(I)};
        }
        break;
    case Instruction::Ret:
        // we need create returns, since
        // these modify CFG and thus data-flow
        return {createReturn(I)};
    case Instruction::Call:
        if (!isRelevantCall(I, _options))
            break;

        return createCall(I);
    }

    return {};
}